

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service_test.cxx
# Opt level: O2

int asio_service_test::global_mgr_heavy_test(void)

{
  long lVar1;
  long lVar2;
  element_type *logs;
  pointer ppRVar3;
  RaftAsioPkg *pRVar4;
  ostream *poVar5;
  undefined8 extraout_RDX;
  undefined8 uVar6;
  undefined8 extraout_RDX_00;
  pointer ppRVar7;
  int iVar8;
  int __how;
  string *psVar9;
  int __fd;
  RaftAsioPkg **entry;
  unsigned_long uVar10;
  initializer_list<std::shared_ptr<nuraft::buffer>_> __l;
  allocator_type local_139;
  vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> pkgs;
  RaftAsioPkg *pkg;
  string addr;
  __shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> local_90;
  ptr<buffer> msg;
  vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
  local_70;
  undefined1 local_58 [16];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_48;
  thread local_40;
  thread local_38;
  
  raft_functional_common::reset_log_files();
  local_38._M_id._M_thread = (id)200;
  local_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
  local_40._M_id._M_thread = (id)2;
  nuraft::nuraft_global_mgr::init((EVP_PKEY_CTX *)&local_48);
  pkgs.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pkgs.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pkgs.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar8 = 1;
  for (uVar10 = 0x4e2a; uVar10 != 0x501e; uVar10 = uVar10 + 10) {
    std::__cxx11::to_string((string *)&pkg,uVar10);
    std::operator+(&addr,"127.0.0.1:",(string *)&pkg);
    std::__cxx11::string::~string((string *)&pkg);
    pRVar4 = (RaftAsioPkg *)operator_new(0x120);
    RaftAsioPkg::RaftAsioPkg(pRVar4,iVar8,&addr);
    pkg = pRVar4;
    std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::push_back(&pkgs,(value_type *)&pkg);
    std::__cxx11::string::~string((string *)&addr);
    iVar8 = iVar8 + 1;
  }
  addr._M_dataplus._M_p._0_1_ = 0;
  addr._M_string_length = 0;
  addr.field_2._M_allocated_capacity = 0;
  addr.field_2._8_8_ = 0;
  iVar8 = launch_servers(&pkgs,false,true,true,(init_options *)&addr);
  std::_Function_base::~_Function_base((_Function_base *)&addr._M_string_length);
  if (iVar8 == 0) {
    std::__cxx11::string::string((string *)&addr,"wait for Raft group ready",(allocator *)&pkg);
    TestSuite::sleep_sec(1,&addr);
    std::__cxx11::string::~string((string *)&addr);
    ppRVar3 = pkgs.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppRVar7 = pkgs.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppRVar7 != ppRVar3; ppRVar7 = ppRVar7 + 1) {
      pRVar4 = *ppRVar7;
      nuraft::raft_server::get_current_params
                ((raft_params *)&addr,
                 (pRVar4->raftServer).
                 super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      nuraft::raft_server::update_params
                ((pRVar4->raftServer).
                 super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 (raft_params *)&addr);
    }
    for (uVar10 = 0; uVar10 != 500; uVar10 = uVar10 + 1) {
      std::__cxx11::to_string(&addr,uVar10);
      nuraft::buffer::alloc
                ((buffer *)&msg.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>,
                 addr._M_string_length + 4);
      nuraft::buffer_serializer::buffer_serializer
                ((buffer_serializer *)&pkg,
                 (ptr<buffer> *)&msg.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>,
                 LITTLE);
      nuraft::buffer_serializer::put_str((buffer_serializer *)&pkg,&addr);
      ppRVar3 = pkgs.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppRVar7 = pkgs.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl.
                     super__Vector_impl_data._M_start; ppRVar7 != ppRVar3; ppRVar7 = ppRVar7 + 1) {
        logs = ((*ppRVar7)->raftServer).
               super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_90,&msg.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>);
        __l._M_len = 1;
        __l._M_array = (iterator)&local_90;
        std::
        vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>::
        vector(&local_70,__l,&local_139);
        nuraft::raft_server::append_entries
                  ((raft_server *)local_58,
                   (vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                    *)logs);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
        std::
        vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>::
        ~vector(&local_70);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&msg.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string((string *)&addr);
    }
    std::__cxx11::string::string((string *)&addr,"wait for replication",(allocator *)&pkg);
    psVar9 = &addr;
    TestSuite::sleep_sec(1,psVar9);
    std::__cxx11::string::~string((string *)&addr);
    ppRVar3 = pkgs.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    uVar6 = extraout_RDX;
    for (ppRVar7 = pkgs.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppRVar7 != ppRVar3; ppRVar7 = ppRVar7 + 1) {
      pRVar4 = *ppRVar7;
      nuraft::raft_server::shutdown
                ((pRVar4->raftServer).
                 super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 (int)psVar9,(int)uVar6);
      RaftAsioPkg::~RaftAsioPkg(pRVar4);
      operator_delete(pRVar4);
      uVar6 = extraout_RDX_00;
    }
    std::__cxx11::string::string((string *)&addr,"shutting down",(allocator *)&pkg);
    psVar9 = &addr;
    TestSuite::sleep_sec(1,psVar9);
    __how = (int)psVar9;
    psVar9 = &addr;
    std::__cxx11::string::~string((string *)psVar9);
    __fd = (int)psVar9;
    SimpleLogger::shutdown(__fd,__how);
    iVar8 = 0;
    nuraft::nuraft_global_mgr::shutdown(__fd,__how);
  }
  else {
    poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar5 = std::operator<<(poVar5,"        time: ");
    poVar5 = std::operator<<(poVar5,"\x1b[1;30m");
    TestSuite::getTimeString_abi_cxx11_();
    poVar5 = std::operator<<(poVar5,(string *)&addr);
    poVar5 = std::operator<<(poVar5,"\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"      thread: ");
    poVar5 = std::operator<<(poVar5,"\x1b[33m");
    lVar1 = *(long *)poVar5;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffffb5 | 8;
    *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
    poVar5 = std::operator<<(poVar5,0x30);
    pkg = (RaftAsioPkg *)pthread_self();
    std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&local_70,(id *)&pkg);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar5 = std::operator<<(poVar5,"\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"          in: ");
    poVar5 = std::operator<<(poVar5,"\x1b[36m");
    poVar5 = std::operator<<(poVar5,"global_mgr_heavy_test");
    poVar5 = std::operator<<(poVar5,"()\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"          at: ");
    poVar5 = std::operator<<(poVar5,"\x1b[32m");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                            );
    poVar5 = std::operator<<(poVar5,"\x1b[0m:");
    poVar5 = std::operator<<(poVar5,"\x1b[1;35m");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x4a4);
    poVar5 = std::operator<<(poVar5,"\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,
                             "    value of: \x1b[1;34mlaunch_servers(pkgs, false, true)\x1b[0m\n");
    poVar5 = std::operator<<(poVar5,"    expected: \x1b[1;32m");
    poVar5 = std::operator<<(poVar5,"0");
    poVar5 = std::operator<<(poVar5,"\x1b[0m\n");
    poVar5 = std::operator<<(poVar5,"      actual: \x1b[1;31m");
    iVar8 = -1;
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,-1);
    std::operator<<(poVar5,"\x1b[0m\n");
    std::__cxx11::string::~string((string *)&addr);
    TestSuite::failHandler();
  }
  std::_Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::~_Vector_base
            (&pkgs.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>);
  return iVar8;
}

Assistant:

int global_mgr_heavy_test() {
    reset_log_files();

    nuraft_global_config g_config;
    g_config.num_commit_threads_ = 2;
    g_config.num_append_threads_ = 2;
    nuraft_global_mgr::init(g_config);
    const size_t NUM_SERVERS = 50;

    std::vector<RaftAsioPkg*> pkgs;
    for (size_t ii = 0; ii < NUM_SERVERS; ++ii) {
        std::string addr = "127.0.0.1:" + std::to_string(20000 + (ii+1) * 10);
        RaftAsioPkg* pkg = new RaftAsioPkg(ii+1, addr);
        pkgs.push_back(pkg);
    }

    CHK_Z( launch_servers(pkgs, false, true) );
    TestSuite::sleep_sec(1, "wait for Raft group ready");

    // Set async.
    for (auto& entry: pkgs) {
        RaftAsioPkg* pp = entry;
        raft_params param = pp->raftServer->get_current_params();
        param.return_method_ = raft_params::async_handler;
        pp->raftServer->update_params(param);
    }

    for (size_t ii=0; ii<500; ++ii) {
        std::string msg_str = std::to_string(ii);
        ptr<buffer> msg = buffer::alloc(sizeof(uint32_t) + msg_str.size());
        buffer_serializer bs(msg);
        bs.put_str(msg_str);

        for (auto& entry: pkgs) {
            RaftAsioPkg* pkg = entry;
            pkg->raftServer->append_entries( {msg} );
        }
    }
    TestSuite::sleep_sec(1, "wait for replication");

    for (auto& entry: pkgs) {
        RaftAsioPkg* pkg = entry;
        pkg->raftServer->shutdown();
        delete pkg;
    }
    TestSuite::sleep_sec(1, "shutting down");

    SimpleLogger::shutdown();
    nuraft_global_mgr::shutdown();
    return 0;
}